

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::floorMesh(Mesh *__return_storage_ptr__,float _area,int _subD,float _y)

{
  __type_conflict _Var1;
  int local_78;
  int local_74;
  int x_1;
  int y;
  vec3 local_68;
  vec4 local_5c;
  vec<3,_float,_(glm::qualifier)0> local_40;
  int local_34;
  int local_30;
  int x;
  int z;
  float h;
  float w;
  float local_1c;
  int N;
  float _y_local;
  int _subD_local;
  float _area_local;
  Mesh *mesh;
  
  local_1c = _y;
  N = _subD;
  _y_local = _area;
  __subD_local = __return_storage_ptr__;
  _Var1 = std::pow<int,int>(2,_subD);
  w = (float)(int)_Var1;
  h._3_1_ = 0;
  Mesh::Mesh(__return_storage_ptr__);
  z = (int)(_y_local / (float)(int)w);
  x = (int)(_y_local / 2.0);
  for (local_30 = 0; local_30 <= (int)w; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 <= (int)w; local_34 = local_34 + 1) {
      glm::vec<3,_float,_(glm::qualifier)0>::vec
                (&local_40,(float)local_34 * (float)z - (float)x,local_1c,
                 (float)local_30 * (float)z - (float)x);
      Mesh::addVertex(__return_storage_ptr__,&local_40);
      glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
                ((vec<4,float,(glm::qualifier)0> *)&local_5c,0.251,0.251,0.251,1.0);
      Mesh::addColor(__return_storage_ptr__,&local_5c);
      glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                ((vec<3,float,(glm::qualifier)0> *)&local_68,0.0,1.0,0.0);
      Mesh::addNormal(__return_storage_ptr__,&local_68);
      glm::vec<2,_float,_(glm::qualifier)0>::vec
                ((vec<2,_float,_(glm::qualifier)0> *)&x_1,(float)local_34 / (float)(int)w,
                 (float)local_30 / (float)(int)w);
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&x_1);
    }
  }
  for (local_74 = 0; local_74 < (int)w; local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < (int)w; local_78 = local_78 + 1) {
      Mesh::addIndex(__return_storage_ptr__,local_78 + local_74 * ((int)w + 1));
      Mesh::addIndex(__return_storage_ptr__,local_78 + 1 + local_74 * ((int)w + 1));
      Mesh::addIndex(__return_storage_ptr__,local_78 + 1 + (local_74 + 1) * ((int)w + 1));
      Mesh::addIndex(__return_storage_ptr__,local_78 + 1 + (local_74 + 1) * ((int)w + 1));
      Mesh::addIndex(__return_storage_ptr__,local_78 + (local_74 + 1) * ((int)w + 1));
      Mesh::addIndex(__return_storage_ptr__,local_78 + local_74 * ((int)w + 1));
    }
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh floorMesh(float _area, int _subD, float _y) {

    int N = pow(2,_subD);

    Mesh mesh;
    float w = _area/float(N);
    float h = _area/2.0;
    for (int z = 0; z <= N; z++){
        for (int x = 0; x <= N; x++){
            mesh.addVertex(glm::vec3(x * w - h, _y, z * w - h));
            mesh.addColor(glm::vec4(0.251, 0.251, 0.251, 1.0));
            mesh.addNormal(glm::vec3(0.0, 1.0, 0.0));
            mesh.addTexCoord(glm::vec2(float(x)/float(N), float(z)/float(N)));
        }
    }
    
    //
    // 0 -- 1 -- 2      A -- B
    // |    |    |      |    | 
    // 3 -- 4 -- 5      C -- D
    // |    |    |
    // 6 -- 7 -- 8
    //
    for (int y = 0; y < N; y++){
        for (int x=0; x < N; x++){
            mesh.addIndex(  x   +   y   * (N+1));   // A
            mesh.addIndex((x+1) +   y   * (N+1));   // B
            mesh.addIndex((x+1) + (y+1) * (N+1));   // D

            mesh.addIndex((x+1) + (y+1) * (N+1));   // D
            mesh.addIndex(  x   + (y+1) * (N+1));   // C
            mesh.addIndex(  x   +   y   * (N+1));   // A
        }
    }
    mesh.computeTangents();

    return mesh;
}